

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh_factories.cpp
# Opt level: O0

tuple<std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
* geometrycentral::surface::makeSurfaceMeshAndGeometry
            (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *polygons,
            vector<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
            *twins,vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                   *vertexPositions,
            vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
            *paramCoordinates)

{
  double dVar1;
  Vertex e;
  Corner e_00;
  bool bVar2;
  const_reference pvVar3;
  Vector3 *pVVar4;
  size_type sVar5;
  pointer pSVar6;
  size_t sVar7;
  const_reference pvVar8;
  size_type sVar9;
  const_reference pvVar10;
  vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *in_RCX;
  tuple<std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  *in_RDI;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *in_R8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> EVar11;
  Corner CVar12;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> EVar13;
  size_t j;
  Halfedge h;
  size_t i;
  unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  parameterization;
  Vertex v;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  VertexSet *__range2;
  unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  geometry;
  unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  mesh;
  vector<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
  *in_stack_00000470;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_00000478;
  SurfaceMesh *in_stack_00000480;
  pointer in_stack_fffffffffffffde8;
  SurfaceMesh *in_stack_fffffffffffffdf0;
  Halfedge *this;
  unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  *this_00;
  ParentMeshT *in_stack_fffffffffffffdf8;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *in_stack_fffffffffffffe00;
  ParentMeshT *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  ParentMeshT *in_stack_fffffffffffffe18;
  MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2> *in_stack_fffffffffffffe20;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffe28;
  SurfaceMesh *in_stack_fffffffffffffe30;
  SurfaceMesh *in_stack_fffffffffffffe88;
  VertexPositionGeometry *in_stack_fffffffffffffe90;
  size_type local_f0;
  ulong local_c8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_a8 [4];
  undefined1 local_68 [24];
  undefined1 *local_50;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *local_28;
  
  local_28 = in_R8;
  ::std::
  unique_ptr<geometrycentral::surface::SurfaceMesh,std::default_delete<geometrycentral::surface::SurfaceMesh>>
  ::unique_ptr<std::default_delete<geometrycentral::surface::SurfaceMesh>,void>
            ((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
              *)in_stack_fffffffffffffdf0);
  bVar2 = ::std::
          vector<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
          ::empty((vector<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
                   *)in_stack_fffffffffffffe00);
  if (bVar2) {
    operator_new(0x308);
    SurfaceMesh::SurfaceMesh(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    ::std::
    unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
    ::reset((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
             *)in_stack_fffffffffffffdf0,(pointer)in_stack_fffffffffffffde8);
  }
  else {
    operator_new(0x308);
    SurfaceMesh::SurfaceMesh(in_stack_00000480,in_stack_00000478,in_stack_00000470);
    ::std::
    unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
    ::reset((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
             *)in_stack_fffffffffffffdf0,(pointer)in_stack_fffffffffffffde8);
  }
  operator_new(0x1880);
  ::std::
  unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  ::operator*((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
               *)in_stack_fffffffffffffdf0);
  VertexPositionGeometry::VertexPositionGeometry
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ::std::
  unique_ptr<geometrycentral::surface::VertexPositionGeometry,std::default_delete<geometrycentral::surface::VertexPositionGeometry>>
  ::unique_ptr<std::default_delete<geometrycentral::surface::VertexPositionGeometry>,void>
            ((unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
              *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ::std::
  unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  ::operator->((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
                *)0x39d465);
  SurfaceMesh::vertices(in_stack_fffffffffffffdf0);
  local_50 = local_68;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_fffffffffffffdf0);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_fffffffffffffdf0);
  while( true ) {
    bVar2 = RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                       in_stack_fffffffffffffdf0,
                       (RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                       in_stack_fffffffffffffde8);
    if (!bVar2) break;
    EVar11 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
             RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator*
                       ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)0x39d4f2);
    local_a8[0] = EVar11;
    sVar7 = Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>::
            getIndex(local_a8);
    pvVar3 = ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::
             operator[](in_RCX,sVar7);
    ::std::
    unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
    ::operator*((unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
                 *)in_stack_fffffffffffffdf0);
    e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         in_stack_fffffffffffffe10;
    e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffe08;
    pVVar4 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator[]
                       (in_stack_fffffffffffffe00,e);
    pVVar4->x = pvVar3->x;
    pVVar4->y = pvVar3->y;
    pVVar4->z = pvVar3->z;
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
               in_stack_fffffffffffffdf0);
  }
  operator_new(0x40);
  ::std::
  unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  ::operator*((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
               *)in_stack_fffffffffffffdf0);
  MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::MeshData
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  ::std::
  unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,geometrycentral::Vector2>,std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,geometrycentral::Vector2>>>
  ::
  unique_ptr<std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,geometrycentral::Vector2>>,void>
            ((unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
              *)in_stack_fffffffffffffdf0,(pointer)in_stack_fffffffffffffde8);
  sVar5 = std::
          vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
          ::size(local_28);
  pSVar6 = ::std::
           unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
           ::operator->((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
                         *)0x39d69e);
  sVar7 = SurfaceMesh::nFaces(pSVar6);
  EVar13.ind = (size_t)in_stack_fffffffffffffdf0;
  EVar13.mesh = in_stack_fffffffffffffdf8;
  if (sVar5 == sVar7) {
    local_c8 = 0;
    while( true ) {
      pSVar6 = ::std::
               unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
               ::operator->((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
                             *)0x39d6ec);
      sVar7 = SurfaceMesh::nFaces(pSVar6);
      if (sVar7 <= local_c8) break;
      ::std::
      unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
      ::operator->((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
                    *)0x39d71b);
      SurfaceMesh::face((SurfaceMesh *)EVar13.ind,(size_t)in_stack_fffffffffffffde8);
      Face::halfedge((Face *)EVar13.ind);
      local_f0 = 0;
      while( true ) {
        sVar5 = local_f0;
        pvVar8 = ::std::
                 vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                 ::operator[]((vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                               *)local_28,local_c8);
        sVar9 = ::std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::
                size(pvVar8);
        if (sVar9 <= sVar5) break;
        pvVar8 = ::std::
                 vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                 ::operator[]((vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                               *)local_28,local_c8);
        pvVar10 = ::std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                  ::operator[](pvVar8,local_f0);
        ::std::
        unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
        ::operator*((unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
                     *)EVar13.ind);
        CVar12 = Halfedge::corner((Halfedge *)0x39d816);
        this = (Halfedge *)EVar13.ind;
        e_00.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
        ind = (size_t)CVar12.
                      super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>
                      .mesh;
        e_00.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
        mesh = (ParentMeshT *)
               CVar12.
               super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>
               .ind;
        in_stack_fffffffffffffe00 =
             (MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *)
             MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::operator[]
                       ((MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2> *)
                        in_stack_fffffffffffffe00,e_00);
        dVar1 = pvVar10->y;
        in_stack_fffffffffffffe00->mesh = (ParentMeshT *)pvVar10->x;
        (in_stack_fffffffffffffe00->defaultValue).x = dVar1;
        EVar13 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )Halfedge::next(this);
        local_f0 = local_f0 + 1;
      }
      local_c8 = local_c8 + 1;
    }
  }
  ::std::
  make_tuple<std::unique_ptr<geometrycentral::surface::SurfaceMesh,std::default_delete<geometrycentral::surface::SurfaceMesh>>,std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,std::default_delete<geometrycentral::surface::VertexPositionGeometry>>,std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,geometrycentral::Vector2>,std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,geometrycentral::Vector2>>>>
            ((unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
              *)EVar13.mesh,
             (unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
              *)EVar13.ind,
             (unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
              *)in_stack_fffffffffffffde8);
  ::std::
  unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  ::~unique_ptr((unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
                 *)EVar13.ind);
  this_00 = (unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
             *)EVar13.ind;
  ::std::
  unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  ::~unique_ptr((unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
                 *)in_stack_fffffffffffffe00);
  ::std::
  unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  ::~unique_ptr(this_00);
  return in_RDI;
}

Assistant:

std::tuple<std::unique_ptr<SurfaceMesh>, std::unique_ptr<VertexPositionGeometry>, std::unique_ptr<CornerData<Vector2>>>
makeSurfaceMeshAndGeometry(const std::vector<std::vector<size_t>>& polygons,
                           const std::vector<std::vector<std::tuple<size_t, size_t>>>& twins,
                           const std::vector<Vector3> vertexPositions,
                           const std::vector<std::vector<Vector2>>& paramCoordinates) {

  // Construct
  std::unique_ptr<SurfaceMesh> mesh;
  if (twins.empty()) {
    mesh.reset(new SurfaceMesh(polygons));
  } else {
    mesh.reset(new SurfaceMesh(polygons, twins));
  }
  std::unique_ptr<VertexPositionGeometry> geometry(new VertexPositionGeometry(*mesh));
  for (Vertex v : mesh->vertices()) {
    // Use the low-level indexers here since we're constructing
    (*geometry).vertexPositions[v] = vertexPositions[v.getIndex()];
  }

  std::unique_ptr<CornerData<Vector2>> parameterization(new CornerData<Vector2>(*mesh));
  if (paramCoordinates.size() == mesh->nFaces()) {
    for (size_t i = 0; i < mesh->nFaces(); i++) {
      Halfedge h = mesh->face(i).halfedge();
      for (size_t j = 0; j < paramCoordinates[i].size(); j++) {
        (*parameterization)[h.corner()] = paramCoordinates[i][j];
        h = h.next();
      }
    }
  }

  return std::make_tuple(std::move(mesh), std::move(geometry), std::move(parameterization));
}